

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

MultiNode<int,_int> * __thiscall
QHashPrivate::iterator<QHashPrivate::MultiNode<int,_int>_>::node
          (iterator<QHashPrivate::MultiNode<int,_int>_> *this)

{
  Span *pSVar1;
  ulong uVar2;
  
  pSVar1 = this->d->spans;
  uVar2 = this->bucket >> 7;
  return (MultiNode<int,_int> *)
         (pSVar1[uVar2].entries + pSVar1[uVar2].offsets[(uint)this->bucket & 0x7f]);
}

Assistant:

inline Node *node() const noexcept
    {
        Q_ASSERT(!isUnused());
        return &d->spans[span()].at(index());
    }